

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

lysp_restr ** lysp_node_musts_p(lysp_node *node)

{
  uint16_t uVar1;
  
  if (node != (lysp_node *)0x0) {
    uVar1 = node->nodetype;
    if ((((((uVar1 == 0x2000) || (uVar1 == 4)) || (uVar1 == 8)) ||
         ((uVar1 == 0x10 || (uVar1 == 0x20)))) ||
        ((uVar1 == 0x60 || ((uVar1 == 0x400 || (uVar1 == 0x1000)))))) || (uVar1 == 1)) {
      return (lysp_restr **)(node + 1);
    }
  }
  return (lysp_restr **)0x0;
}

Assistant:

struct lysp_restr **
lysp_node_musts_p(const struct lysp_node *node)
{
    if (!node) {
        return NULL;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysp_node_container *)node)->musts;
    case LYS_LEAF:
        return &((struct lysp_node_leaf *)node)->musts;
    case LYS_LEAFLIST:
        return &((struct lysp_node_leaflist *)node)->musts;
    case LYS_LIST:
        return &((struct lysp_node_list *)node)->musts;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return &((struct lysp_node_anydata *)node)->musts;
    case LYS_NOTIF:
        return &((struct lysp_node_notif *)node)->musts;
    case LYS_INPUT:
    case LYS_OUTPUT:
        return &((struct lysp_node_action_inout *)node)->musts;
    default:
        return NULL;
    }
}